

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxequilisc.hpp
# Opt level: O3

void soplex::
     SPxEquiliSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
     ::computeEquiExpVec(SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *vecset,vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 *coScaleVal,DataArray<int> *scaleExp,
                        number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *epsilon)

{
  cpp_dec_float<50U,_int,_void> *pcVar1;
  Item *pIVar2;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar3;
  undefined8 uVar4;
  double __x;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint uVar8;
  DataArray<int> *pDVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  cpp_dec_float<50U,_int,_void> *pcVar13;
  cpp_dec_float<50U,_int,_void> *v;
  char cVar14;
  long lVar15;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  cpp_dec_float<50U,_int,_void> local_1d8;
  cpp_dec_float<50U,_int,_void> local_198;
  cpp_dec_float<50U,_int,_void> local_158;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_118;
  DataArray<int> *local_110;
  long local_108;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *local_100;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f8;
  Item *local_f0;
  cpp_dec_float<50U,_int,_void> local_e8;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  if (0 < (vecset->set).thenum) {
    local_108 = 0;
    local_118 = vecset;
    local_110 = scaleExp;
    local_100 = coScaleVal;
    local_f8 = epsilon;
    do {
      pIVar2 = (local_118->set).theitem;
      iVar11 = (local_118->set).thekey[local_108].idx;
      local_198.fpclass = cpp_dec_float_finite;
      local_198.prec_elem = 10;
      local_198.data._M_elems[0] = 0;
      local_198.data._M_elems[1] = 0;
      local_198.data._M_elems[2] = 0;
      local_198.data._M_elems[3] = 0;
      local_198.data._M_elems[4] = 0;
      local_198.data._M_elems[5] = 0;
      local_198.data._M_elems[6] = 0;
      local_198.data._M_elems[7] = 0;
      local_198.data._M_elems[8] = 0;
      local_198.data._M_elems[9] = 0;
      local_198.exp = 0;
      local_198.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_198,0.0);
      if (0 < pIVar2[iVar11].data.
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused) {
        local_f0 = pIVar2 + iVar11;
        lVar15 = 0;
        lVar12 = 0;
        do {
          pNVar3 = (local_f0->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          pcVar1 = (cpp_dec_float<50U,_int,_void> *)((long)&(pNVar3->val).m_backend.data + lVar15);
          pcVar13 = &(local_100->
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     )._M_impl.super__Vector_impl_data._M_start
                     [*(uint *)((long)(&pNVar3->val + 1) + lVar15)].m_backend;
          local_1d8.fpclass = cpp_dec_float_finite;
          local_1d8.prec_elem = 10;
          local_1d8.data._M_elems[0] = 0;
          local_1d8.data._M_elems[1] = 0;
          local_1d8.data._M_elems[2] = 0;
          local_1d8.data._M_elems[3] = 0;
          local_1d8.data._M_elems[4] = 0;
          local_1d8.data._M_elems[5] = 0;
          local_1d8.data._M_elems[6] = 0;
          local_1d8.data._M_elems[7] = 0;
          local_1d8.data._M_elems[8] = 0;
          local_1d8.data._M_elems[9] = 0;
          local_1d8.exp = 0;
          local_1d8.neg = false;
          v = pcVar1;
          if ((&local_1d8 != pcVar13) && (v = pcVar13, pcVar1 != &local_1d8)) {
            uVar4 = *(undefined8 *)((pcVar1->data)._M_elems + 8);
            local_1d8.data._M_elems[8] = (uint)uVar4;
            local_1d8.data._M_elems[9] = (uint)((ulong)uVar4 >> 0x20);
            uVar4 = *(undefined8 *)(pcVar1->data)._M_elems;
            uVar5 = *(undefined8 *)((pcVar1->data)._M_elems + 2);
            uVar6 = *(undefined8 *)((pcVar1->data)._M_elems + 4);
            uVar7 = *(undefined8 *)((pcVar1->data)._M_elems + 6);
            local_1d8.data._M_elems[4] = (uint)uVar6;
            local_1d8.data._M_elems[5] = (uint)((ulong)uVar6 >> 0x20);
            local_1d8.data._M_elems[6] = (uint)uVar7;
            local_1d8.data._M_elems[7] = (uint)((ulong)uVar7 >> 0x20);
            local_1d8.data._M_elems[0] = (uint)uVar4;
            local_1d8.data._M_elems[1] = (uint)((ulong)uVar4 >> 0x20);
            local_1d8.data._M_elems[2] = (uint)uVar5;
            local_1d8.data._M_elems[3] = (uint)((ulong)uVar5 >> 0x20);
            local_1d8.exp = *(int *)((long)&(pNVar3->val).m_backend.data + lVar15 + 0x28);
            local_1d8.neg = *(bool *)((long)&(pNVar3->val).m_backend.data + lVar15 + 0x2c);
            local_1d8._48_8_ = *(undefined8 *)((long)&(pNVar3->val).m_backend.data + lVar15 + 0x30);
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_1d8,v);
          uVar4 = local_1d8._48_8_;
          iVar11 = local_1d8.exp;
          uVar8 = local_1d8.data._M_elems[0];
          local_e8.data._M_elems[1] = local_1d8.data._M_elems[2];
          local_e8.data._M_elems[0] = local_1d8.data._M_elems[1];
          local_e8.data._M_elems[3] = local_1d8.data._M_elems[4];
          local_e8.data._M_elems[2] = local_1d8.data._M_elems[3];
          local_e8.data._M_elems[5] = local_1d8.data._M_elems[6];
          local_e8.data._M_elems[4] = local_1d8.data._M_elems[5];
          local_e8.data._M_elems._24_5_ =
               SUB85(CONCAT44(local_1d8.data._M_elems[8],local_1d8.data._M_elems[7]),0);
          local_e8.data._M_elems[7]._1_3_ = (undefined3)(local_1d8.data._M_elems[8] >> 8);
          local_e8.data._M_elems[8] = local_1d8.data._M_elems[9];
          cVar14 = local_1d8.neg;
          if (local_1d8.neg == true) {
            cVar14 = local_1d8.fpclass == cpp_dec_float_finite && local_1d8.data._M_elems[0] == 0;
          }
          local_68.data._M_elems[9] = local_198.data._M_elems[9];
          local_68.data._M_elems[8] = local_198.data._M_elems[8];
          local_68.data._M_elems[1] = local_198.data._M_elems[1];
          local_68.data._M_elems[0] = local_198.data._M_elems[0];
          local_68.data._M_elems[3] = local_198.data._M_elems[3];
          local_68.data._M_elems[2] = local_198.data._M_elems[2];
          local_68.data._M_elems[5] = local_198.data._M_elems[5];
          local_68.data._M_elems[4] = local_198.data._M_elems[4];
          local_68.data._M_elems[7] = local_198.data._M_elems[7];
          local_68.data._M_elems[6] = local_198.data._M_elems[6];
          local_68.exp = local_198.exp;
          local_68.neg = local_198.neg;
          local_68.fpclass = local_198.fpclass;
          local_68.prec_elem = local_198.prec_elem;
          local_a8.data._M_elems._0_8_ = *(undefined8 *)(local_f8->m_backend).data._M_elems;
          local_a8.data._M_elems._8_8_ = *(undefined8 *)((local_f8->m_backend).data._M_elems + 2);
          local_a8.data._M_elems._16_8_ = *(undefined8 *)((local_f8->m_backend).data._M_elems + 4);
          local_a8.data._M_elems._24_8_ = *(undefined8 *)((local_f8->m_backend).data._M_elems + 6);
          local_a8.data._M_elems._32_8_ = *(undefined8 *)((local_f8->m_backend).data._M_elems + 8);
          local_a8.exp = (local_f8->m_backend).exp;
          local_a8.neg = (local_f8->m_backend).neg;
          local_a8.fpclass = (local_f8->m_backend).fpclass;
          local_a8.prec_elem = (local_f8->m_backend).prec_elem;
          local_158.data._M_elems[0] = local_1d8.data._M_elems[0];
          local_158.data._M_elems[9] = local_1d8.data._M_elems[9];
          local_158.data._M_elems[5] = local_1d8.data._M_elems[5];
          local_158.data._M_elems[6] = local_1d8.data._M_elems[6];
          local_158.data._M_elems[7] = local_1d8.data._M_elems[7];
          local_158.data._M_elems[8] = local_1d8.data._M_elems[8];
          local_158.data._M_elems[1] = local_1d8.data._M_elems[1];
          local_158.data._M_elems[2] = local_1d8.data._M_elems[2];
          local_158.data._M_elems[3] = local_1d8.data._M_elems[3];
          local_158.data._M_elems[4] = local_1d8.data._M_elems[4];
          local_158.exp = local_1d8.exp;
          local_158.fpclass = local_1d8.fpclass;
          local_158.prec_elem = local_1d8.prec_elem;
          local_158.neg = (bool)cVar14;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_158,&local_68);
          if (((local_158.fpclass != cpp_dec_float_NaN) && (local_a8.fpclass != cpp_dec_float_NaN))
             && (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    (&local_158,&local_a8), 0 < iVar10)) {
            local_198.data._M_elems[0] = uVar8;
            local_198.data._M_elems[9] = local_e8.data._M_elems[8];
            local_198.data._M_elems[5] = local_e8.data._M_elems[4];
            local_198.data._M_elems[6] = local_e8.data._M_elems[5];
            local_198.data._M_elems[7] = local_e8.data._M_elems[6];
            local_198.data._M_elems[8] =
                 (uint)(CONCAT35(local_e8.data._M_elems[7]._1_3_,local_e8.data._M_elems._24_5_) >>
                       0x20);
            local_198.data._M_elems[1] = local_e8.data._M_elems[0];
            local_198.data._M_elems[2] = local_e8.data._M_elems[1];
            local_198.data._M_elems[3] = local_e8.data._M_elems[2];
            local_198.data._M_elems[4] = local_e8.data._M_elems[3];
            local_198.exp = iVar11;
            local_1d8.fpclass = (fpclass_type)uVar4;
            local_1d8.prec_elem = SUB84(uVar4,4);
            local_198.fpclass = local_1d8.fpclass;
            local_198.prec_elem = local_1d8.prec_elem;
            local_198.neg = (bool)cVar14;
          }
          lVar12 = lVar12 + 1;
          lVar15 = lVar15 + 0x3c;
        } while (lVar12 < (local_f0->data).
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .memused);
      }
      if (local_198.fpclass != cpp_dec_float_NaN) {
        local_158.fpclass = cpp_dec_float_finite;
        local_158.prec_elem = 10;
        local_158.data._M_elems[0] = 0;
        local_158.data._M_elems[1] = 0;
        local_158.data._M_elems[2] = 0;
        local_158.data._M_elems[3] = 0;
        local_158.data._M_elems[4] = 0;
        local_158.data._M_elems[5] = 0;
        local_158.data._M_elems[6] = 0;
        local_158.data._M_elems[7] = 0;
        local_158.data._M_elems[8] = 0;
        local_158.data._M_elems[9] = 0;
        local_158.exp = 0;
        local_158.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_158,0.0);
        iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_198,&local_158);
        if (iVar11 == 0) {
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_198,1.0);
        }
      }
      local_e8.fpclass = cpp_dec_float_finite;
      local_e8.prec_elem = 10;
      local_e8.data._M_elems[0] = 0;
      local_e8.data._M_elems[1] = 0;
      local_e8.data._M_elems[2] = 0;
      local_e8.data._M_elems[3] = 0;
      local_e8.data._M_elems[4] = 0;
      local_e8.data._M_elems[5] = 0;
      local_e8.data._M_elems._24_5_ = 0;
      local_e8.data._M_elems[7]._1_3_ = 0;
      local_e8.data._M_elems[8] = 0;
      local_e8.data._M_elems[9]._0_1_ = 0;
      local_e8._37_8_ = 0;
      local_158.fpclass = cpp_dec_float_finite;
      local_158.prec_elem = 10;
      local_158.data._M_elems[0] = 0;
      local_158.data._M_elems[1] = 0;
      local_158.data._M_elems[2] = 0;
      local_158.data._M_elems[3] = 0;
      local_158.data._M_elems[4] = 0;
      local_158.data._M_elems[5] = 0;
      local_158.data._M_elems[6] = 0;
      local_158.data._M_elems[7] = 0;
      local_158.data._M_elems[8] = 0;
      local_158.data._M_elems[9] = 0;
      local_158.exp = 0;
      local_158.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_158,1.0);
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_e8,&local_158,&local_198);
      __x = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::extract_double
                      (&local_e8);
      lVar12 = local_108;
      pDVar9 = local_110;
      frexp(__x,local_110->data + local_108);
      pDVar9->data[lVar12] = pDVar9->data[lVar12] + -1;
      local_108 = lVar12 + 1;
    } while (local_108 < (local_118->set).thenum);
  }
  return;
}

Assistant:

void SPxEquiliSC<R>::computeEquiExpVec(const SVSetBase<R>* vecset, const std::vector<R>& coScaleVal,
                                       DataArray<int>& scaleExp, R epsilon)
{
   assert(vecset != nullptr);

   for(int i = 0; i < vecset->num(); ++i)
   {
      const SVectorBase<R>& vec = (*vecset)[i];

      R maxi = 0.0;

      for(int j = 0; j < vec.size(); ++j)
      {
         assert(vec.index(j) >= 0);
         const R x = spxAbs(vec.value(j) * coScaleVal[unsigned(vec.index(j))]);

         if(GT(x, maxi, epsilon))
            maxi = x;
      }

      // empty rows/cols are possible
      if(maxi == 0.0)
         maxi = 1.0;

      assert(maxi > 0.0);

      spxFrexp(Real(1.0 / maxi), &(scaleExp[i]));

      scaleExp[i] -= 1;
   }
}